

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayNew * __thiscall
wasm::Builder::makeArrayNew(Builder *this,HeapType type,Expression *size,Expression *init)

{
  Type local_38;
  ArrayNew *local_30;
  ArrayNew *ret;
  Expression *init_local;
  Expression *size_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (ArrayNew *)init;
  init_local = size;
  size_local = (Expression *)this;
  this_local = (Builder *)type.id;
  local_30 = MixedArena::alloc<wasm::ArrayNew>(&this->wasm->allocator);
  local_30->size = init_local;
  local_30->init = (Expression *)ret;
  Type::Type(&local_38,(HeapType)this_local,NonNullable,Inexact);
  (local_30->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id =
       local_38.id;
  wasm::ArrayNew::finalize();
  return local_30;
}

Assistant:

ArrayNew*
  makeArrayNew(HeapType type, Expression* size, Expression* init = nullptr) {
    auto* ret = wasm.allocator.alloc<ArrayNew>();
    ret->size = size;
    ret->init = init;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }